

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O2

bool __thiscall gnilk::IPCFifoUnix::Open(IPCFifoUnix *this)

{
  string *__source;
  bool bVar1;
  __pid_t __val;
  int iVar2;
  path pStack_a8;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar1 = true;
  if (this->isOpen == false) {
    __val = getpid();
    __source = &this->fifoname;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&pStack_a8,__source,auto_format);
    bVar1 = std::filesystem::exists(&pStack_a8);
    std::filesystem::__cxx11::path::~path(&pStack_a8);
    if (bVar1) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&pStack_a8,__source,auto_format);
      std::filesystem::remove(&pStack_a8);
      std::filesystem::__cxx11::path::~path(&pStack_a8);
    }
    std::operator+(&local_60,&fifoBaseName_abi_cxx11_,"_");
    std::__cxx11::to_string(&local_80,__val);
    std::operator+(&pStack_a8._M_pathname,&local_60,&local_80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__source,&pStack_a8._M_pathname);
    std::__cxx11::string::~string((string *)&pStack_a8);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    iVar2 = mkfifo((this->fifoname)._M_dataplus._M_p,0x1b6);
    this->fifofd = iVar2;
    if (iVar2 < 0) {
      perror("IPCFifoUnix::Open, mkfifo");
      bVar1 = false;
    }
    else {
      this->isOwner = true;
      std::__cxx11::string::string((string *)&local_40,__source);
      bVar1 = ConnectTo(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return bVar1;
}

Assistant:

bool IPCFifoUnix::Open() {
    if (isOpen) {
        return true;
    }

    // Create name with pid - we need to be able to run multiple app's in parallel...
    auto pid = getpid();

    // if it exists - remove it - as it ought to be a left over from an old process or someone restarted the logger
    if (std::filesystem::exists(fifoname)) {
        std::filesystem::remove(fifoname);
    }

    fifoname = fifoBaseName + "_" + std::to_string(pid);

    // Create the fifo
    fifofd = mkfifo(fifoname.c_str(), 0666);
    if (fifofd < 0) {
        perror("IPCFifoUnix::Open, mkfifo");
        return false;
    }
    isOwner = true;
    return ConnectTo(fifoname);
}